

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O2

DescriptorFlags __thiscall
Js::PathTypeHandlerWithAttr::GetSetter
          (PathTypeHandlerWithAttr *this,DynamicObject *instance,
          JavascriptString *propertyNameString,Var *setterValue,PropertyValueInfo *info,
          ScriptContext *requestContext)

{
  DescriptorFlags DVar1;
  PropertyRecord *local_40;
  PropertyRecord *propertyRecord;
  
  propertyRecord = (PropertyRecord *)requestContext;
  ScriptContext::GetOrAddPropertyRecord
            ((((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
             super_JavascriptLibraryBase).scriptContext.ptr,propertyNameString,&local_40);
  DVar1 = (*(this->super_PathTypeHandlerNoAttr).super_PathTypeHandlerBase.super_DynamicTypeHandler.
            _vptr_DynamicTypeHandler[0x1a])
                    (this,instance,(ulong)(uint)local_40->pid,setterValue,info,propertyRecord);
  return DVar1;
}

Assistant:

DescriptorFlags PathTypeHandlerWithAttr::GetSetter(DynamicObject* instance, JavascriptString* propertyNameString, Var* setterValue, PropertyValueInfo* info, ScriptContext* requestContext)
    {
        PropertyRecord const* propertyRecord;
        instance->GetScriptContext()->GetOrAddPropertyRecord(propertyNameString, &propertyRecord);
        return this->GetSetter(instance, propertyRecord->GetPropertyId(), setterValue, info, requestContext);
    }